

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
LiteralSubstitutionTree
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this)

{
  uint uVar1;
  LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RDI;
  undefined4 in_stack_ffffffffffffffec;
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
  *in_stack_fffffffffffffff0;
  
  LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LiteralIndexingStructure
            (in_RDI);
  in_RDI->_vptr_LiteralIndexingStructure = (_func_int **)&PTR__LiteralSubstitutionTree_0130ec00;
  uVar1 = Kernel::Signature::predicates((Signature *)0x4249ae);
  Lib::
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
  ::Stack(in_stack_fffffffffffffff0,CONCAT44(in_stack_ffffffffffffffec,uVar1));
  return;
}

Assistant:

LiteralSubstitutionTree()
    : _trees(env.signature->predicates() * 2)
    { }